

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_TestParamSet.c
# Opt level: O3

void fiat_id_GostR3410_2001_TestParamSet_inv(uint64_t *output,uint64_t *t1)

{
  int iVar1;
  fe_t_conflict acc;
  fe_t_conflict t15;
  uint64_t auStack_68 [4];
  uint64_t local_48 [4];
  
  fiat_id_GostR3410_2001_TestParamSet_square(auStack_68,t1);
  fiat_id_GostR3410_2001_TestParamSet_mul(local_48,t1,auStack_68);
  iVar1 = 6;
  do {
    fiat_id_GostR3410_2001_TestParamSet_mul(local_48,local_48,auStack_68);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_TestParamSet_square(auStack_68,t1);
  iVar1 = 0xf4;
  do {
    fiat_id_GostR3410_2001_TestParamSet_square(auStack_68,auStack_68);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_TestParamSet_mul(auStack_68,auStack_68,t1);
  iVar1 = 5;
  do {
    fiat_id_GostR3410_2001_TestParamSet_square(auStack_68,auStack_68);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_TestParamSet_mul(auStack_68,auStack_68,t1);
  iVar1 = 5;
  do {
    fiat_id_GostR3410_2001_TestParamSet_square(auStack_68,auStack_68);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_TestParamSet_mul(output,auStack_68,local_48);
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_TestParamSet_inv(fe_t output,
                                                    const fe_t t1) {
    int i;
    /* temporary variables */
    fe_t acc, t15;

    fiat_id_GostR3410_2001_TestParamSet_square(acc, t1);
    fiat_id_GostR3410_2001_TestParamSet_mul(t15, t1, acc);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_TestParamSet_mul(t15, t15, acc);
    fiat_id_GostR3410_2001_TestParamSet_square(acc, t1);
    for (i = 0; i < 244; i++)
        fiat_id_GostR3410_2001_TestParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_TestParamSet_mul(acc, acc, t1);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_TestParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_TestParamSet_mul(acc, acc, t1);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_TestParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_TestParamSet_mul(output, acc, t15);
}